

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O3

void __thiscall
cmListFileFunction::Implementation::Implementation
          (Implementation *this,string *name,long line,long lineEnd,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pcVar5;
  
  paVar1 = &(this->OriginalName).field_2;
  (this->OriginalName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->OriginalName).field_2 + 8) = uVar4;
  }
  else {
    (this->OriginalName)._M_dataplus._M_p = pcVar3;
    (this->OriginalName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->OriginalName)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  cmsys::SystemTools::LowerCase(&this->LowerCaseName,&this->OriginalName);
  this->Line = line;
  this->LineEnd = lineEnd;
  pcVar5 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = pcVar5;
  (this->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Implementation(std::string name, long line, long lineEnd,
                   std::vector<cmListFileArgument> args)
      : OriginalName{ std::move(name) }
      , LowerCaseName{ cmSystemTools::LowerCase(this->OriginalName) }
      , Line{ line }
      , LineEnd{ lineEnd }
      , Arguments{ std::move(args) }
    {
    }